

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O3

void __thiscall
test_vector_dense_vector_subtraction_assignment_Test::
~test_vector_dense_vector_subtraction_assignment_Test
          (test_vector_dense_vector_subtraction_assignment_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_dense, vector_subtraction_assignment) {
  Vector_Dense<Scalar, 0> dynamic_vector_0 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 0> dynamic_vector_1 = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 3> static_vector_0 = {-4.0, -5.0, -6.0};
  Vector_Dense<Scalar, 3> static_vector_1 = {-4.0, -5.0, -6.0};

  // assignment of dynamic vectors
  dynamic_vector_0 -= dynamic_vector_1;
  static_vector_0 -= dynamic_vector_1;
  FOR_EACH(element, dynamic_vector_0) EXPECT_DOUBLE_EQ(element, 0.0);
  FOR_EACH(element, static_vector_0) EXPECT_DOUBLE_EQ(element, -3.0);

  // assignment of static vectors
  dynamic_vector_0 = {-1.0, -2.0, -3.0};
  static_vector_0 = {-4.0, -5.0, -6.0};
  dynamic_vector_0 -= static_vector_1;
  static_vector_0 -= static_vector_1;
  FOR_EACH(element, dynamic_vector_0) EXPECT_DOUBLE_EQ(element, 3.0);
  FOR_EACH(element, static_vector_0) EXPECT_DOUBLE_EQ(element, 0.0);

  Vector_Dense<Scalar, 0> dynamic_vector_2;
  Vector_Dense<Scalar, 2> static_vector_2;
  EXPECT_DEATH(dynamic_vector_0 -= dynamic_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 -= dynamic_vector_2, "./*");
  EXPECT_DEATH(dynamic_vector_0 -= static_vector_2, "./*");
  EXPECT_DEATH(static_vector_0 -= static_vector_2, "./*");
}